

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

void runImagePair(void)

{
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [8];
  Mat img2;
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [8];
  Mat img1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"../data/nn_left.jpg",&local_89);
  cv::imread(local_68,(int)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"../data/nn_right.jpg",&local_121);
  cv::imread(local_100,(int)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  imresize((Mat *)local_68,0x1e0);
  imresize((Mat *)local_100,0x1e0);
  GmsMatch((Mat *)local_68,(Mat *)local_100);
  cv::Mat::~Mat((Mat *)local_100);
  cv::Mat::~Mat((Mat *)local_68);
  return;
}

Assistant:

void runImagePair(){
	Mat img1 = imread("../data/nn_left.jpg");
	Mat img2 = imread("../data/nn_right.jpg");

	imresize(img1, 480);
	imresize(img2, 480);

	GmsMatch(img1, img2);
}